

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::write_date_time(char *buff,size_t buff_size)

{
  undefined1 local_88 [8];
  tm time_info;
  time_t sec_since_epoch;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  long local_38;
  longlong ms_since_epoch;
  time_point now;
  size_t buff_size_local;
  char *buff_local;
  
  now.__d.__r = (duration)(duration)buff_size;
  ms_since_epoch = std::chrono::_V2::system_clock::now();
  sec_since_epoch =
       (time_t)std::chrono::
               time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&ms_since_epoch);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&sec_since_epoch);
  local_38 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
  time_info.tm_zone = (char *)(local_38 / 1000);
  localtime_r((time_t *)&time_info.tm_zone,(tm *)local_88);
  snprintf(buff,(size_t)now.__d.__r,"%04d%02d%02d_%02d%02d%02d.%03lld",
           (ulong)(time_info.tm_mday + 0x76c),(ulong)(time_info.tm_hour + 1),
           (ulong)(uint)time_info.tm_min,time_info.tm_sec,local_88._4_4_,local_88._0_4_,
           local_38 % 1000);
  return;
}

Assistant:

void write_date_time(char* buff, size_t buff_size)
	{
		auto now = system_clock::now();
		long long ms_since_epoch = duration_cast<milliseconds>(now.time_since_epoch()).count();
		time_t sec_since_epoch = time_t(ms_since_epoch / 1000);
		tm time_info;
		localtime_r(&sec_since_epoch, &time_info);
		snprintf(buff, buff_size, "%04d%02d%02d_%02d%02d%02d.%03lld",
			1900 + time_info.tm_year, 1 + time_info.tm_mon, time_info.tm_mday,
			time_info.tm_hour, time_info.tm_min, time_info.tm_sec, ms_since_epoch % 1000);
	}